

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::LabelTests_SAMTBackwardApply_Test::TestBody(LabelTests_SAMTBackwardApply_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  string_view line;
  AssertionResult gtest_ar_3;
  Span root;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  string_view local_b8;
  AssertHelper local_a8;
  Span local_9c;
  Tree local_98;
  SAMTLabeler local_78;
  
  line._M_str = "(ROOT (A foo) bar)";
  line._M_len = 0x12;
  readTree(&local_98,line);
  local_b8._M_len._0_4_ = 2;
  local_c8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
              _M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_78,"2","t.size()",(int *)&local_b8,(unsigned_long *)&local_c8);
  if ((char)local_78.super_Labeler._vptr_Labeler == '\0') {
    testing::Message::Message((Message *)&local_c8);
    if (local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)&(local_78.tree_.
                           super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                           _M_impl.super__Vector_impl_data._M_start)->span;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.tree_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.tree_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_9c.start = 0;
    local_9c.end = 2;
    testing::internal::CmpHelperEQ<jhu::thrax::Span,jhu::thrax::Span>
              ((internal *)&local_78,"root","t.front().span",&local_9c,
               &(local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start)->span);
    if ((char)local_78.super_Labeler._vptr_Labeler == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if (local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)&(local_78.tree_.
                             super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                             ._M_impl.super__Vector_impl_data._M_start)->span;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
                 ,0x5b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.tree_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_9c.end = 1;
    testing::internal::CmpHelperEQ<jhu::thrax::Span,jhu::thrax::Span>
              ((internal *)&local_78,"root","t.back().span",&local_9c,
               &local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].span);
    if ((char)local_78.super_Labeler._vptr_Labeler == '\0') {
      testing::Message::Message((Message *)&local_c8);
      if (local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)&(local_78.tree_.
                             super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                             ._M_impl.super__Vector_impl_data._M_start)->span;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
                 ,0x5d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.tree_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_78.key_.label.field_2;
    local_78.super_Labeler._vptr_Labeler = (_func_int **)&PTR_operator___00168cf8;
    local_78.cache_.
    super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.cache_.
    super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_78.cache_.
    super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_78.cache_.
    super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_78._52_8_ = 0;
    local_78.key_.label._M_string_length = 0;
    local_78.key_.label.field_2._M_local_buf[0] = '\0';
    local_78.key_.label._M_dataplus._M_p = (pointer)paVar1;
    local_b8 = SAMTLabeler::operator()(&local_78,(SpanPair)0x2000100000000);
    testing::internal::CmpHelperEQ<char[7],std::basic_string_view<char,std::char_traits<char>>>
              ((internal *)&local_c8,"\"ROOT\\\\A\"","sl(SpanPair{{}, { 1, 2 }})",
               (char (*) [7])"ROOT\\A",&local_b8);
    if (local_c8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
                 ,0x5f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (local_b8._M_len != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)local_b8._M_len != (long *)0x0)) {
          (**(code **)(*(long *)local_b8._M_len + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_78.super_Labeler._vptr_Labeler = (_func_int **)&PTR_operator___00168cf8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.key_.label._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.key_.label._M_dataplus._M_p,
                      CONCAT71(local_78.key_.label.field_2._M_allocated_capacity._1_7_,
                               local_78.key_.label.field_2._M_local_buf[0]) + 1);
    }
    std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::~vector
              (&local_78.cache_);
    if (local_78.tree_.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.tree_.
                      super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.tree_.
                            super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.tree_.
                            super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(LabelTests, SAMTBackwardApply) {
  auto t = readTree("(ROOT (A foo) bar)");
  ASSERT_EQ(2, t.size());
  Span root{0, 2};
  EXPECT_EQ(root, t.front().span);
  root.end = 1;
  EXPECT_EQ(root, t.back().span);
  SAMTLabeler sl(std::move(t));
  EXPECT_EQ("ROOT\\A", sl(SpanPair{{}, { 1, 2 }}));
}